

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall kratos::GeneratorPortVisitor::visit(GeneratorPortVisitor *this,Generator *generator)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined8 *puVar5;
  undefined1 local_40 [8];
  shared_ptr<kratos::Port> port;
  
  iVar2 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    p_Var3 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        Generator::get_port((Generator *)local_40,(string *)generator);
        process_port(generator,(Port *)local_40,(string *)(p_Var3 + 1));
        if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    for (p_Var4 = (generator->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(generator->interfaces_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      for (puVar5 = *(undefined8 **)(*(long *)(p_Var4 + 2) + 0x58); puVar5 != (undefined8 *)0x0;
          puVar5 = (undefined8 *)*puVar5) {
        process_port(generator,(Port *)puVar5[5],(string *)(puVar5 + 1));
      }
    }
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (!generator->parent()) {
            // this is top level module, no need to worry about it
            return;
        }
        auto const& port_names = generator->get_port_names();

        for (auto const& port_name : port_names) {
            auto port = generator->get_port(port_name);
            process_port(generator, port.get(), port_name);
        }
        // for internal interface ports
        const auto& interfaces = generator->interfaces();
        for (auto const& iter : interfaces) {
            auto const& interface = iter.second;
            auto const& ports = interface->ports();
            for (auto const& [port_name, port] : ports) {
                process_port(generator, port, port_name);
            }
        }
    }